

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InverseKinematics.cpp
# Opt level: O2

Model * __thiscall iDynTree::InverseKinematics::reducedModel(InverseKinematics *this)

{
  do {
    missingIpoptErrorReport();
  } while( true );
}

Assistant:

const Model& InverseKinematics::reducedModel() const
    {
#ifdef IDYNTREE_USES_IPOPT
        assert(m_pimpl);
        return IK_PIMPL(m_pimpl)->m_reducedVariablesInfo.reducedModel;
#else
        missingIpoptErrorReport();
        return this->reducedModel();
#endif
    }